

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O3

int gray_raster_render(PWorker worker,void *buffer,long buffer_size,PVG_FT_Raster_Params *params)

{
  int *piVar1;
  PVG_FT_Vector *pPVar2;
  long lVar3;
  long lVar4;
  PVG_FT_Pos PVar5;
  PVG_FT_Pos PVar6;
  char *pcVar7;
  int *piVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  PCell_conflict pTVar17;
  TCoord x;
  PVG_FT_Pos PVar18;
  long lVar19;
  uint uVar20;
  PVG_FT_SpanFunc p_Var21;
  long lVar22;
  PVG_FT_Vector *pPVar23;
  TBand *band;
  int num_bands;
  int n;
  TPos max;
  TPos min;
  TPos max_y;
  TBand bands [40];
  long *local_2e0;
  int local_2d8;
  int local_2d4;
  long local_2d0;
  long local_2c8;
  long local_2b8;
  long local_2b0;
  
  piVar1 = (int *)params->source;
  if (piVar1 != (int *)0x0) {
    if (piVar1[1] == 0) {
      return 0;
    }
    if ((long)*piVar1 < 1) {
      return 0;
    }
    if ((*(long *)(piVar1 + 6) != 0) && (*(long *)(piVar1 + 2) != 0)) {
      if (piVar1[1] != *(int *)(*(long *)(piVar1 + 6) + -4 + (long)*piVar1 * 4) + 1) {
        return -1;
      }
      if ((~params->flags & 3U) != 0) {
        return -2;
      }
      if ((params->flags & 4U) == 0) {
        (worker->clip_box).xMin = -0x800000;
        (worker->clip_box).yMin = -0x800000;
        (worker->clip_box).xMax = 0x7fffff;
        (worker->clip_box).yMax = 0x7fffff;
      }
      else {
        PVar18 = (params->clip_box).xMin;
        PVar5 = (params->clip_box).yMin;
        PVar6 = (params->clip_box).yMax;
        (worker->clip_box).xMax = (params->clip_box).xMax;
        (worker->clip_box).yMax = PVar6;
        (worker->clip_box).xMin = PVar18;
        (worker->clip_box).yMin = PVar5;
      }
      worker->buffer = buffer;
      worker->buffer_size = buffer_size;
      worker->ycells = (PCell_conflict *)buffer;
      worker->area = 0;
      worker->cover = 0;
      worker->invalid = 1;
      worker->cells = (PCell_conflict)0x0;
      worker->max_cells = 0;
      worker->num_cells = 0;
      iVar12 = piVar1[1];
      pPVar2 = *(PVG_FT_Vector **)(piVar1 + 2);
      pcVar7 = *(char **)(piVar1 + 4);
      piVar8 = *(int **)(piVar1 + 6);
      pcVar9 = *(char **)(piVar1 + 8);
      iVar11 = piVar1[10];
      iVar10 = piVar1[0xb];
      (worker->outline).n_contours = piVar1[0];
      (worker->outline).n_points = iVar12;
      (worker->outline).points = pPVar2;
      (worker->outline).tags = pcVar7;
      (worker->outline).contours = piVar8;
      (worker->outline).contours_flag = pcVar9;
      (worker->outline).flags = iVar11;
      *(int *)&(worker->outline).field_0x2c = iVar10;
      worker->invalid = 1;
      iVar11 = (int)(buffer_size / 0xc0);
      worker->band_size = iVar11;
      p_Var21 = params->gray_spans;
      worker->render_span = p_Var21;
      worker->render_span_data = params->user;
      worker->num_gray_spans = 0;
      iVar12 = (worker->outline).n_points;
      if ((long)iVar12 < 1) {
        worker->min_ey = 0;
        worker->max_ey = 0;
        worker->min_ex = 0;
        worker->max_ex = 0;
        local_2c8 = 0;
        lVar14 = 0;
        lVar22 = 0;
        lVar19 = 0;
      }
      else {
        pPVar2 = (worker->outline).points;
        PVar18 = pPVar2->x;
        lVar14 = pPVar2->y;
        local_2c8 = lVar14;
        lVar22 = PVar18;
        if (iVar12 != 1) {
          pPVar23 = pPVar2 + 1;
          do {
            lVar19 = pPVar23->x;
            if (lVar19 < lVar22) {
              lVar22 = lVar19;
            }
            lVar13 = pPVar23->y;
            if (PVar18 < lVar19) {
              PVar18 = lVar19;
            }
            if (lVar13 < local_2c8) {
              local_2c8 = lVar13;
            }
            if (lVar14 < lVar13) {
              lVar14 = lVar13;
            }
            pPVar23 = pPVar23 + 1;
          } while (pPVar23 < pPVar2 + iVar12);
        }
        lVar22 = lVar22 >> 6;
        worker->min_ex = lVar22;
        local_2c8 = local_2c8 >> 6;
        worker->min_ey = local_2c8;
        lVar19 = PVar18 + 0x3f >> 6;
        worker->max_ex = lVar19;
        lVar14 = lVar14 + 0x3f >> 6;
        worker->max_ey = lVar14;
      }
      lVar13 = (worker->clip_box).xMin;
      if (lVar19 <= lVar13) {
        return 0;
      }
      lVar15 = (worker->clip_box).xMax;
      if (lVar15 <= lVar22) {
        return 0;
      }
      lVar3 = (worker->clip_box).yMin;
      if (lVar14 <= lVar3) {
        return 0;
      }
      lVar4 = (worker->clip_box).yMax;
      if (lVar4 <= local_2c8) {
        return 0;
      }
      if (lVar22 < lVar13) {
        worker->min_ex = lVar13;
        lVar22 = lVar13;
      }
      if (local_2c8 < lVar3) {
        worker->min_ey = lVar3;
        local_2c8 = lVar3;
      }
      if (lVar15 < lVar19) {
        worker->max_ex = lVar15;
        lVar19 = lVar15;
      }
      if (lVar4 < lVar14) {
        worker->max_ey = lVar4;
        lVar14 = lVar4;
      }
      worker->count_ex = lVar19 - lVar22;
      worker->count_ey = lVar14 - local_2c8;
      local_2d8 = (int)((lVar14 - local_2c8) / (long)iVar11);
      if (local_2d8 == 0) {
        local_2d8 = 1;
      }
      if (0x26 < local_2d8) {
        local_2d8 = 0x27;
      }
      iVar12 = 0;
      worker->band_shoot = 0;
      local_2d4 = 0;
      if (0 < local_2d8) {
LAB_0011a457:
        local_2e0 = &local_2b8;
        local_2d0 = worker->band_size + local_2c8;
        if ((local_2d4 == local_2d8 + -1) || (lVar14 < local_2d0)) {
          local_2d0 = lVar14;
        }
        local_2b8 = local_2c8;
        local_2b0 = local_2d0;
LAB_0011a4a8:
        do {
          if (local_2e0 < &local_2b8) goto LAB_0011a712;
          worker->ycells = (PCell_conflict *)worker->buffer;
          lVar22 = local_2e0[1] - *local_2e0;
          worker->ycount = lVar22;
          iVar11 = (int)lVar22 * 8;
          lVar19 = (long)iVar11 + ((ulong)(long)iVar11 / 3 & 0xfffffffffffffff8) * -3;
          iVar12 = (iVar11 - (int)lVar19) + 0x18;
          if (lVar19 == 0) {
            iVar12 = iVar11;
          }
          lVar19 = (long)((int)((ulong)(long)(int)worker->buffer_size / 0x18) * 0x18);
          lVar15 = (long)iVar12;
          worker->cells = (PCell_conflict)((long)worker->buffer + lVar15);
          lVar13 = lVar19 - lVar15;
          if ((lVar13 != 0 && lVar15 <= lVar19) &&
             (worker->max_cells = (lVar13 >> 3) * -0x5555555555555555, 0x2f < lVar13)) {
            if (0 < lVar22) {
              lVar19 = 0;
              do {
                worker->ycells[lVar19] = (PCell_conflict)0x0;
                lVar19 = lVar19 + 1;
              } while (lVar22 != lVar19);
            }
            worker->num_cells = 0;
            worker->invalid = 1;
            worker->min_ey = *local_2e0;
            worker->max_ey = local_2e0[1];
            worker->count_ey = local_2e0[1] - *local_2e0;
            iVar12 = gray_convert_glyph_inner(worker);
            if (iVar12 != -4) {
              if (iVar12 != 0) {
                return 1;
              }
              if ((worker->num_cells != 0) && (0 < worker->ycount)) {
                lVar19 = 0;
                do {
                  pTVar17 = worker->ycells[lVar19];
                  if (pTVar17 != (PCell_conflict)0x0) {
                    x = 0;
                    lVar22 = 0;
                    do {
                      uVar20 = pTVar17->x;
                      if ((lVar22 != 0) && (x < (int)uVar20)) {
                        gray_hline(worker,x,lVar19,lVar22 << 9,uVar20 - (int)x);
                        uVar20 = pTVar17->x;
                      }
                      lVar22 = lVar22 + pTVar17->cover;
                      lVar13 = lVar22 * 0x200 - pTVar17->area;
                      if ((lVar13 != 0) && (-1 < (int)uVar20)) {
                        gray_hline(worker,(ulong)uVar20,lVar19,lVar13,1);
                        uVar20 = pTVar17->x;
                      }
                      x = (TCoord)(int)(uVar20 + 1);
                      pTVar17 = pTVar17->next;
                    } while (pTVar17 != (PCell)0x0);
                    if ((lVar22 != 0) && (x < worker->count_ex)) {
                      gray_hline(worker,x,lVar19,lVar22 * 0x200,(int)worker->count_ex - (uVar20 + 1)
                                );
                    }
                  }
                  lVar19 = lVar19 + 1;
                } while (lVar19 < worker->ycount);
              }
              local_2e0 = local_2e0 + -2;
              goto LAB_0011a4a8;
            }
          }
          lVar19 = *local_2e0;
          lVar22 = local_2e0[1];
          if ((ulong)(lVar22 - lVar19) < 2) {
            return -6;
          }
          if ((long)worker->band_size <= lVar19 - lVar22) {
            worker->band_shoot = worker->band_shoot + 1;
          }
          lVar13 = (lVar22 - lVar19 >> 1) + lVar19;
          local_2e0[2] = lVar19;
          local_2e0[3] = lVar13;
          *local_2e0 = lVar13;
          local_2e0[1] = lVar22;
          local_2e0 = local_2e0 + 2;
        } while( true );
      }
      goto LAB_0011a73b;
    }
  }
  return -1;
LAB_0011a712:
  local_2d4 = local_2d4 + 1;
  local_2c8 = local_2d0;
  if (local_2d8 <= local_2d4) goto code_r0x0011a72e;
  goto LAB_0011a457;
code_r0x0011a72e:
  iVar12 = worker->num_gray_spans;
  p_Var21 = worker->render_span;
LAB_0011a73b:
  if ((p_Var21 != (PVG_FT_SpanFunc)0x0) && (uVar20 = worker->skip_spans, (int)uVar20 < iVar12)) {
    uVar16 = 0;
    if (0 < (int)uVar20) {
      uVar16 = (ulong)uVar20;
    }
    (*p_Var21)(iVar12 - (int)uVar16,worker->gray_spans + uVar16,worker->render_span_data);
    iVar12 = worker->num_gray_spans;
  }
  worker->skip_spans = worker->skip_spans - iVar12;
  if (worker->band_shoot < 9) {
    return 0;
  }
  if (worker->band_size < 0x11) {
    return 0;
  }
  worker->band_size = (uint)worker->band_size >> 1;
  return 0;
}

Assistant:

static int
  gray_raster_render( RAS_ARG_ void* buffer, long buffer_size,
                      const PVG_FT_Raster_Params*  params )
  {
    const PVG_FT_Outline*  outline    = (const PVG_FT_Outline*)params->source;
    if ( outline == NULL )
      return ErrRaster_Invalid_Outline;

    /* return immediately if the outline is empty */
    if ( outline->n_points == 0 || outline->n_contours <= 0 )
      return 0;

    if ( !outline->contours || !outline->points )
      return ErrRaster_Invalid_Outline;

    if ( outline->n_points !=
           outline->contours[outline->n_contours - 1] + 1 )
      return ErrRaster_Invalid_Outline;

    /* this version does not support monochrome rendering */
    if ( !( params->flags & PVG_FT_RASTER_FLAG_AA ) )
      return ErrRaster_Invalid_Mode;

    if ( !( params->flags & PVG_FT_RASTER_FLAG_DIRECT ) )
      return ErrRaster_Invalid_Mode;

    /* compute clipping box */
    if ( params->flags & PVG_FT_RASTER_FLAG_CLIP )
    {
      ras.clip_box = params->clip_box;
    }
    else
    {
      ras.clip_box.xMin = -(1 << 23);
      ras.clip_box.yMin = -(1 << 23);
      ras.clip_box.xMax =  (1 << 23) - 1;
      ras.clip_box.yMax =  (1 << 23) - 1;
    }

    gray_init_cells( RAS_VAR_ buffer, buffer_size );

    ras.outline   = *outline;
    ras.num_cells = 0;
    ras.invalid   = 1;
    ras.band_size = (int)(buffer_size / (long)(sizeof(TCell) * 8));

    ras.render_span      = (PVG_FT_Raster_Span_Func)params->gray_spans;
    ras.render_span_data = params->user;

    return gray_convert_glyph( RAS_VAR );
  }